

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O0

void __thiscall
disruptor::test::SequenceBarrierFixture::~SequenceBarrierFixture(SequenceBarrierFixture *this)

{
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *unaff_retaddr;
  
  SequenceBarrier<disruptor::BusySpinStrategy>::~SequenceBarrier
            ((SequenceBarrier<disruptor::BusySpinStrategy> *)0x10edaf);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector(unaff_retaddr)
  ;
  return;
}

Assistant:

SequenceBarrierFixture() : barrier(wait_strategy, cursor, dependents) {}